

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filescan.cc
# Opt level: O1

RC __thiscall RM_FileScan::GetNextRec(RM_FileScan *this,RM_Record *rec)

{
  PF_PageHandle *ph;
  bool bVar1;
  RC RVar2;
  int iVar3;
  int iVar4;
  RC RVar5;
  char *pData;
  RID rid;
  RM_Record temprec;
  RM_PageHeader *local_70;
  RM_Record *local_68;
  PageNum *local_60;
  RID local_58;
  SlotNum *local_50;
  RM_Record local_48;
  
  RVar5 = 0x6e;
  if (this->scanEnded == false) {
    if (this->openScan == false) {
      RVar5 = 0x6c;
    }
    else {
      this->hasPagePinned = true;
      local_60 = &this->scanPage;
      local_50 = &this->scanSlot;
      ph = &this->currentPH;
      local_68 = rec;
      do {
        RM_Record::RM_Record(&local_48);
        RVar2 = RM_FileHandle::GetNextRecord
                          (this->fileHandle,this->scanPage,this->scanSlot,&local_48,ph,
                           this->useNextPage);
        iVar4 = 1;
        if (RVar2 == 0) {
          this->hasPagePinned = true;
          if (this->useNextPage == true) {
            RVar2 = RM_FileHandle::GetPageDataAndBitmap
                              (this->fileHandle,ph,(char **)&local_58,&local_70);
            if (RVar2 == 0) {
              this->numRecOnPage = local_70->numRecords;
            }
            this->useNextPage = false;
            this->numSeenOnPage = 0;
            if (this->numRecOnPage == 1) {
              PF_PageHandle::GetPageNum(ph,local_60);
            }
          }
          iVar3 = this->numSeenOnPage + 1;
          this->numSeenOnPage = iVar3;
          if (this->numRecOnPage == iVar3) {
            this->useNextPage = true;
            RVar2 = PF_FileHandle::UnpinPage(&this->fileHandle->pfh,this->scanPage);
            if (RVar2 != 0) goto LAB_0011b730;
            this->hasPagePinned = false;
          }
          RID::RID(&local_58);
          RM_Record::GetRid(&local_48,&local_58);
          RID::GetPageNum(&local_58,local_60);
          RID::GetSlotNum(&local_58,local_50);
          RVar2 = RM_Record::GetData(&local_48,(char **)&local_70);
          if (RVar2 == 0) {
            if (this->compOp == NO_OP) {
              iVar4 = 3;
              RM_Record::operator=(local_68,&local_48);
            }
            else {
              bVar1 = (*this->comparator)((void *)((long)&local_70->nextFreePage +
                                                  (long)this->attrOffset),this->value,this->attrType
                                          ,this->attrLength);
              iVar4 = 0;
              if (bVar1) {
                iVar4 = 3;
                RM_Record::operator=(local_68,&local_48);
              }
            }
          }
          else {
            iVar4 = 1;
            RVar5 = RVar2;
          }
          RID::~RID(&local_58);
          RVar2 = RVar5;
        }
        else if (RVar2 == 0x6e) {
          this->hasPagePinned = false;
          this->scanEnded = true;
        }
LAB_0011b730:
        RVar5 = RVar2;
        RM_Record::~RM_Record(&local_48);
      } while (iVar4 == 0);
      if (iVar4 == 3) {
        RVar5 = 0;
      }
    }
  }
  return RVar5;
}

Assistant:

RC RM_FileScan::GetNextRec(RM_Record &rec) {
  // If the scan has ended, or is not valid, return immediately
  if(scanEnded == true)
    return (RM_EOF);
  if(openScan == false)
    return (RM_INVALIDSCAN);
  hasPagePinned = true;
  
  RC rc;
  while(true){
    // Retrieve next record
    RM_Record temprec;
    if((rc=fileHandle->GetNextRecord(scanPage, scanSlot, temprec, currentPH, useNextPage))){
      if(rc == RM_EOF){
        hasPagePinned = false;
        scanEnded = true;
      }
      return (rc);
    }
    hasPagePinned = true;
    // If we retrieved a record on the next page, reset numRecOnPage to
    // reflect the number of records seen on this new current page
    if(useNextPage){
      GetNumRecOnPage(currentPH, numRecOnPage);
      useNextPage = false;
      numSeenOnPage = 0;
      if(numRecOnPage == 1)
        currentPH.GetPageNum(scanPage);
    }
    numSeenOnPage++; // update # of records seen on this page

    // If we've seen all the record on this page, then next time, we 
    // need to look on the next page, not this page, so unpin the page
    // and set the indicator (useNextPage)
    if(numRecOnPage == numSeenOnPage){
      useNextPage = true;
      //printf("unpin page in filescan\n");
      if(rc = fileHandle->pfh.UnpinPage(scanPage)){
        return (rc);
      }
      hasPagePinned = false;
    }
   
    // Retrieves the RID of the scan to update the progress of the scan
    RID rid;
    temprec.GetRid(rid);
    rid.GetPageNum(scanPage);
    rid.GetSlotNum(scanSlot);

    // Check to see if it satisfies the scan comparison, and if it does,
    // exit the function, returning the record.
    char *pData;
    if((rc = temprec.GetData(pData))){
      return (rc);
    }
    if(compOp != NO_OP){
      bool satisfies = (* comparator)(pData + attrOffset, this->value, attrType, attrLength);
      if(satisfies){
        rec = temprec;
        break;
      }
    }
    else{
      rec = temprec; // if no comparison, just return the record
      break;
    }
  }
  return (0);
}